

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O0

void VTuneChakraProfile::LogMethodNativeLoadEvent
               (FunctionBody *body,FunctionEntryPointInfo *entryPoint)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  undefined4 *puVar6;
  Memory *pMVar7;
  ptrdiff_t pVar8;
  utf8char_t *obj;
  utf8char_t *utf8Url;
  size_t urlLength;
  code *pcStack_340;
  int size;
  undefined8 local_338;
  TrackAllocData local_330;
  _LineNumberInfo *local_308;
  LineNumberInfo *pLineInfo;
  undefined4 local_2f8;
  uint lineCount;
  LineNumberInfo numberInfo [1];
  TrackAllocData local_2e0;
  utf8char_t *local_2b8;
  utf8char_t *utf8MethodName;
  size_t cbUtf8MethodName;
  uint32 uStack_2a0;
  charcount_t ccMethodLength;
  size_t methodLength;
  char16 numberBuffer [20];
  WCHAR local_268 [2];
  ULONG lineNumber;
  char16 methodNameBuffer [260];
  char16 *methodName;
  iJIT_Method_Load methodInfo;
  FunctionEntryPointInfo *entryPoint_local;
  FunctionBody *body_local;
  
  if (isJitProfilingActive) {
    methodInfo.source_file_name = (char *)entryPoint;
    memset(&methodName,0,0x40);
    methodNameBuffer._512_8_ =
         Js::ParseableFunctionInfo::GetExternalDisplayName(&body->super_ParseableFunctionInfo);
    numberBuffer._36_4_ =
         Js::ParseableFunctionInfo::GetLineNumber(&body->super_ParseableFunctionInfo);
    _ltow_s<20ul>((ulong)(uint)numberBuffer._36_4_,(WCHAR (*) [20])&methodLength,10);
    wcscpy_s<260ul>((WCHAR (*) [260])local_268,(WCHAR *)methodNameBuffer._512_8_);
    EVar2 = Js::FunctionEntryPointInfo::GetJitMode
                      ((FunctionEntryPointInfo *)methodInfo.source_file_name);
    if (EVar2 == SimpleJit) {
      wcscat_s<260ul>((WCHAR (*) [260])local_268,L" Simple");
    }
    wcscat_s<260ul>((WCHAR (*) [260])local_268,L" {line:");
    wcscat_s<260ul>((WCHAR (*) [260])local_268,(WCHAR *)&methodLength);
    wcscat_s<260ul>((WCHAR (*) [260])local_268,L"}");
    _uStack_2a0 = PAL_wcslen(local_268);
    if (0x103 < _uStack_2a0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
                         ,0x42,"(methodLength < 260)","methodLength < _MAX_PATH");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    cbUtf8MethodName._4_4_ = uStack_2a0;
    uVar4 = UInt32Math::MulAdd<3u,1u>(uStack_2a0);
    utf8MethodName = (utf8char_t *)(ulong)uVar4;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_2e0,(type_info *)&unsigned_char::typeinfo,0,(size_t)utf8MethodName,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
               ,0x45);
    pMVar7 = (Memory *)
             Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_2e0);
    numberInfo[0] = (LineNumberInfo)Memory::HeapAllocator::NoThrowAlloc;
    local_2b8 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                          (pMVar7,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                           (size_t)utf8MethodName);
    if (local_2b8 != (uchar *)0x0) {
      methodName._0_4_ = iJIT_GetNewMethodID();
      utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                (local_2b8,(size_t)utf8MethodName,local_268,cbUtf8MethodName._4_4_);
      methodInfo._0_8_ = local_2b8;
      methodInfo.method_name =
           (char *)Js::EntryPointInfo::GetNativeAddress
                             ((EntryPointInfo *)methodInfo.source_file_name);
      pVar8 = Js::EntryPointInfo::GetCodeSize((EntryPointInfo *)methodInfo.source_file_name);
      methodInfo.method_load_address._0_4_ = (undefined4)pVar8;
      iVar5 = Js::EntryPointInfo::GetNativeOffsetMapCount
                        ((EntryPointInfo *)methodInfo.source_file_name);
      pLineInfo._4_4_ = iVar5 * 2 + 1;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_330,(type_info *)&_LineNumberInfo::typeinfo,0,(ulong)pLineInfo._4_4_,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
                 ,0x51);
      pMVar7 = (Memory *)
               Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_330);
      pcStack_340 = Memory::HeapAllocator::NoThrowAlloc;
      local_338 = 0;
      local_308 = Memory::AllocateArray<Memory::HeapAllocator,_LineNumberInfo,true>
                            (pMVar7,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                             (ulong)pLineInfo._4_4_);
      if ((local_308 == (_LineNumberInfo *)0x0) || ((DAT_01ea1253 & 1) != 0)) {
        lineCount._0_2_ = numberBuffer[0x12];
        lineCount._2_2_ = numberBuffer[0x13];
        local_2f8 = 0;
        methodInfo.method_load_address._4_4_ = 1;
        methodInfo._24_8_ = &local_2f8;
      }
      else {
        urlLength._4_4_ =
             Js::EntryPointInfo::PopulateLineInfo
                       ((EntryPointInfo *)methodInfo.source_file_name,local_308,body);
        methodInfo._24_8_ = local_308;
        methodInfo.method_load_address._4_4_ = urlLength._4_4_;
      }
      utf8Url = (utf8char_t *)0x0;
      obj = GetUrl(body,(size_t *)&utf8Url);
      methodInfo.class_file_name = (char *)obj;
      Output::Trace(ProfilerPhase,L"Method load event: %s\n",local_268);
      iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED,&methodName);
      Memory::DeleteArray<Memory::HeapAllocator,_LineNumberInfo>
                (&Memory::HeapAllocator::Instance,(ulong)pLineInfo._4_4_,local_308);
      if (utf8Url != (utf8char_t *)0x0) {
        Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
                  (&Memory::HeapAllocator::Instance,(size_t)utf8Url,obj);
      }
      Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
                (&Memory::HeapAllocator::Instance,(size_t)utf8MethodName,local_2b8);
    }
  }
  return;
}

Assistant:

void VTuneChakraProfile::LogMethodNativeLoadEvent(Js::FunctionBody* body, Js::FunctionEntryPointInfo* entryPoint)
{
#if ENABLE_NATIVE_CODEGEN
    if (isJitProfilingActive)
    {
        iJIT_Method_Load methodInfo;
        memset(&methodInfo, 0, sizeof(iJIT_Method_Load));
        const char16* methodName = body->GetExternalDisplayName();
        // Append function line number info to method name so that VTune can distinguish between polymorphic methods
        char16 methodNameBuffer[_MAX_PATH];
        ULONG lineNumber = body->GetLineNumber();
        char16 numberBuffer[20];
        _ltow_s(lineNumber, numberBuffer, 10);
        wcscpy_s(methodNameBuffer, methodName);
        if (entryPoint->GetJitMode() == ExecutionMode::SimpleJit)
        {
            wcscat_s(methodNameBuffer, _u(" Simple"));
        }
        wcscat_s(methodNameBuffer, _u(" {line:"));
        wcscat_s(methodNameBuffer, numberBuffer);
        wcscat_s(methodNameBuffer, _u("}"));

        size_t methodLength = wcslen(methodNameBuffer);
        Assert(methodLength < _MAX_PATH);
        charcount_t ccMethodLength = static_cast<charcount_t>(methodLength);
        size_t cbUtf8MethodName = UInt32Math::MulAdd<3, 1>(ccMethodLength);
        utf8char_t* utf8MethodName = HeapNewNoThrowArray(utf8char_t, cbUtf8MethodName);
        if (utf8MethodName)
        {
            methodInfo.method_id = iJIT_GetNewMethodID();
            utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8MethodName, cbUtf8MethodName, methodNameBuffer, ccMethodLength);
            methodInfo.method_name = (char*)utf8MethodName;
            methodInfo.method_load_address = (void*)entryPoint->GetNativeAddress();
            methodInfo.method_size = (uint)entryPoint->GetCodeSize();        // Size in memory - Must be exact

            LineNumberInfo numberInfo[1];

            uint lineCount = (entryPoint->GetNativeOffsetMapCount()) * 2 + 1; // may need to record both .begin and .end for all elements
            LineNumberInfo* pLineInfo = HeapNewNoThrowArray(LineNumberInfo, lineCount);

            if (pLineInfo == NULL || Js::Configuration::Global.flags.DisableVTuneSourceLineInfo)
            {
                // resort to original implementation, attribute all samples to first line
                numberInfo[0].LineNumber = lineNumber;
                numberInfo[0].Offset = 0;
                methodInfo.line_number_size = 1;
                methodInfo.line_number_table = numberInfo;
            }
            else
            {
                int size = entryPoint->PopulateLineInfo(pLineInfo, body);
                methodInfo.line_number_size = size;
                methodInfo.line_number_table = pLineInfo;
            }

            size_t urlLength = 0;
            utf8char_t* utf8Url = GetUrl(body, &urlLength);
            methodInfo.source_file_name = (char*)utf8Url;
            OUTPUT_TRACE(Js::ProfilerPhase, _u("Method load event: %s\n"), methodNameBuffer);
            iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED, &methodInfo);

            HeapDeleteArray(lineCount, pLineInfo);

            if (urlLength > 0)
            {
                HeapDeleteArray(urlLength, utf8Url);
            }

            HeapDeleteArray(cbUtf8MethodName, utf8MethodName);
        }
    }
#endif
}